

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pushdown_left_join.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ReplaceColRefWithNull
          (duckdb *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *right_bindings)

{
  pointer pEVar1;
  BoundColumnRefExpression *pBVar2;
  iterator iVar3;
  type expr_00;
  pointer *__ptr;
  undefined8 local_78;
  LogicalType local_70;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (expr);
  if ((pEVar1->super_BaseExpression).type == BOUND_COLUMN_REF) {
    pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(expr);
    pBVar2 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&pEVar1->super_BaseExpression);
    iVar3 = ::std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&right_bindings->_M_h,&(pBVar2->binding).table_index);
    if (iVar3.super__Node_iterator_base<unsigned_long,_false>._M_cur != (__node_type *)0x0) {
      pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(expr);
      LogicalType::LogicalType(&local_70,&pEVar1->return_type);
      Value::Value((Value *)&local_58,&local_70);
      make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
                ((duckdb *)&local_78,(Value *)&local_58);
      *(undefined8 *)this = local_78;
      local_78 = 0;
      Value::~Value((Value *)&local_58);
      LogicalType::~LogicalType(&local_70);
      return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
    }
  }
  else {
    expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator*(expr);
    local_58._8_8_ = 0;
    local_40 = ::std::
               _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/pushdown/pushdown_left_join.cpp:44:13)>
               ::_M_invoke;
    local_48 = ::std::
               _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/pushdown/pushdown_left_join.cpp:44:13)>
               ::_M_manager;
    local_58._M_unused._M_object = right_bindings;
    ExpressionIterator::EnumerateChildren
              (expr_00,(function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&)>
                        *)&local_58);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_58);
  }
  *(Expression **)this =
       (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

static unique_ptr<Expression> ReplaceColRefWithNull(unique_ptr<Expression> expr, unordered_set<idx_t> &right_bindings) {
	if (expr->GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
		auto &bound_colref = expr->Cast<BoundColumnRefExpression>();
		if (right_bindings.find(bound_colref.binding.table_index) != right_bindings.end()) {
			// bound colref belongs to RHS
			// replace it with a constant NULL
			return make_uniq<BoundConstantExpression>(Value(expr->return_type));
		}
		return expr;
	}
	ExpressionIterator::EnumerateChildren(
	    *expr, [&](unique_ptr<Expression> &child) { child = ReplaceColRefWithNull(std::move(child), right_bindings); });
	return expr;
}